

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.h
# Opt level: O2

char * absl::LogSeverityName(LogSeverity s)

{
  if (s < 4) {
    return &DAT_0015b814 + *(int *)(&DAT_0015b814 + (ulong)s * 4);
  }
  return "UNKNOWN";
}

Assistant:

constexpr const char* LogSeverityName(absl::LogSeverity s) {
  switch (s) {
    case absl::LogSeverity::kInfo: return "INFO";
    case absl::LogSeverity::kWarning: return "WARNING";
    case absl::LogSeverity::kError: return "ERROR";
    case absl::LogSeverity::kFatal: return "FATAL";
  }
  return "UNKNOWN";
}